

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Train.cpp
# Opt level: O0

bool __thiscall tiger::trains::world::Train::upgrade(Train *this)

{
  initializer_list<int> __l;
  byte bVar1;
  vector<int,_std::allocator<int>_> *trainIdxList;
  vector<int,_std::allocator<int>_> *in_RDI;
  undefined7 in_stack_ffffffffffffff40;
  UpgradeModel *this_00;
  allocator_type *in_stack_ffffffffffffff68;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  iterator in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffff80;
  UpgradeModel local_65 [2];
  
  trainIdxList = (vector<int,_std::allocator<int>_> *)
                 World::getCommandSender
                           ((World *)(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                     .super__Vector_impl_data._M_end_of_storage);
  local_65[0].trainIdxList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start._1_4_ =
       *(undefined4 *)
        &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
  local_65[0].trainIdxList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._5_8_ =
       (long)&local_65[0].trainIdxList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
  local_65[0].trainIdxList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._13_8_ = 1;
  this_00 = local_65;
  std::allocator<int>::allocator((allocator<int> *)0x23b14b);
  __l._M_len = in_stack_ffffffffffffff80;
  __l._M_array = in_stack_ffffffffffffff78;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff70,__l,in_stack_ffffffffffffff68);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x23b186);
  models::UpgradeModel::UpgradeModel(this_00,trainIdxList,in_RDI);
  bVar1 = (**(code **)((trainIdxList->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + 6))
                    (trainIdxList,
                     (undefined1 *)
                     ((long)&local_65[0].postIdxList.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  models::UpgradeModel::~UpgradeModel((UpgradeModel *)CONCAT17(bVar1,in_stack_ffffffffffffff40));
  std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
  std::allocator<int>::~allocator((allocator<int> *)0x23b1e6);
  return (bool)(bVar1 & 1);
}

Assistant:

bool Train::upgrade() const
{
    return (owner->getCommandSender()->upgrade(models::UpgradeModel({idx}, {})));
}